

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

CURLMcode Curl_pipeline_set_server_blacklist(char **servers,curl_llist *list)

{
  size_t sVar1;
  void *ne;
  size_t len;
  blacklist_node *n;
  curl_llist *list_local;
  char **servers_local;
  
  if (list->size != 0) {
    Curl_llist_destroy(list,(void *)0x0);
  }
  if (servers != (char **)0x0) {
    Curl_llist_init(list,server_blacklist_llist_dtor);
    for (list_local = (curl_llist *)servers; list_local->head != (curl_llist_element *)0x0;
        list_local = (curl_llist *)&list_local->tail) {
      sVar1 = strlen((char *)list_local->head);
      ne = (*Curl_cmalloc)(sVar1 + 0x20);
      if (ne == (void *)0x0) {
        Curl_llist_destroy(list,(void *)0x0);
        return CURLM_OUT_OF_MEMORY;
      }
      strcpy((char *)((long)ne + 0x18),(char *)list_local->head);
      Curl_llist_insert_next(list,list->tail,ne,(curl_llist_element *)ne);
    }
  }
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_pipeline_set_server_blacklist(char **servers,
                                             struct curl_llist *list)
{
  /* Free the old list */
  if(list->size)
    Curl_llist_destroy(list, NULL);

  if(servers) {
    Curl_llist_init(list, (curl_llist_dtor) server_blacklist_llist_dtor);

    /* Parse the URLs and populate the list */
    while(*servers) {
      struct blacklist_node *n;
      size_t len = strlen(*servers);

      n = malloc(sizeof(struct blacklist_node) + len);
      if(!n) {
        Curl_llist_destroy(list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }
      strcpy(n->server_name, *servers);

      Curl_llist_insert_next(list, list->tail, n, &n->list);
      servers++;
    }
  }


  return CURLM_OK;
}